

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O1

boolean is_swamp(level *lev,int x,int y)

{
  char cVar1;
  
  if ((uint)y < 0x15 && x - 1U < 0x4f) {
    cVar1 = lev->locations[(uint)x][(uint)y].typ;
    if (cVar1 == '#') {
      return '\x01';
    }
    if ((cVar1 == '\x14') &&
       ((*(uint *)&lev->locations[(uint)x][(uint)y].field_0x6 & 0x1c0) == 0x100)) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

boolean is_swamp(struct level *lev, int x, int y)
{
    schar ltyp;

    if (!isok(x,y)) return FALSE;
    ltyp = lev->locations[x][y].typ;
    if (ltyp == BOG
	|| (ltyp == DRAWBRIDGE_UP
	    && (lev->locations[x][y].drawbridgemask & DB_UNDER) == DB_BOG)) return TRUE;
    return FALSE;
}